

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyDrawIndexedAttribs(DrawIndexedAttribs *Attribs)

{
  undefined *puVar1;
  Char *Message;
  undefined8 uVar2;
  char (*in_R9) [34];
  undefined1 local_88 [8];
  string _msg_1;
  string _msg;
  Char *local_38;
  undefined1 local_30 [8];
  string msg;
  DrawIndexedAttribs *Attribs_local;
  
  msg.field_2._8_8_ = Attribs;
  if ((Attribs->IndexType != VT_UINT16) && (Attribs->IndexType != VT_UINT32)) {
    local_38 = GetValueTypeString(Attribs->IndexType);
    FormatString<char[35],char[12],char_const*,char[34]>
              ((string *)local_30,(Diligent *)"Draw indexed attribs are invalid: ",
               (char (*) [35])0xf4d511,(char (*) [12])&local_38,
               (char **)") must be VT_UINT16 or VT_UINT32.",in_R9);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"VerifyDrawIndexedAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x44);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (*(int *)msg.field_2._8_8_ == 0) {
    FormatString<char[110]>
              ((string *)((long)&_msg_1.field_2 + 8),
               (char (*) [110])
               "DrawIndexedAttribs.NumIndices is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
  }
  if (*(int *)(msg.field_2._8_8_ + 8) == 0) {
    FormatString<char[105]>((string *)local_88,(char (*) [105])0xf4c49f);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  return true;
}

Assistant:

bool VerifyDrawIndexedAttribs(const DrawIndexedAttribs& Attribs)
{
#define CHECK_DRAW_INDEXED_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw indexed attribs are invalid: ", __VA_ARGS__)

    CHECK_DRAW_INDEXED_ATTRIBS(Attribs.IndexType == VT_UINT16 || Attribs.IndexType == VT_UINT32,
                               "IndexType (", GetValueTypeString(Attribs.IndexType), ") must be VT_UINT16 or VT_UINT32.");

    if (Attribs.NumIndices == 0)
        LOG_INFO_MESSAGE("DrawIndexedAttribs.NumIndices is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.NumInstances == 0)
        LOG_INFO_MESSAGE("DrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional.");

#undef CHECK_DRAW_INDEXED_ATTRIBS

    return true;
}